

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O1

string_view __thiscall
gmlc::utilities::string_viewOps::removeQuotes(string_viewOps *this,string_view str)

{
  ulong uVar2;
  uint uVar4;
  string_view input;
  string_view sVar5;
  string_view trimCharacters;
  size_t sVar1;
  byte *pbVar3;
  
  input._M_str = (char *)str._M_len;
  input._M_len = (size_t)this;
  trimCharacters._M_str = " \t\n\r";
  trimCharacters._M_len = 4;
  sVar5 = trim(input,trimCharacters);
  pbVar3 = (byte *)sVar5._M_str;
  sVar1 = sVar5._M_len;
  if (sVar1 != 0) {
    uVar4 = *pbVar3 - 0x22;
    if (((uVar4 < 0x3f) && ((0x4000000000000021U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) &&
       (pbVar3[sVar1 - 1] == *pbVar3)) {
      uVar2 = sVar1 - 1;
      if (sVar1 - 2 <= sVar1 - 1) {
        uVar2 = sVar1 - 2;
      }
      sVar5._M_str = (char *)(pbVar3 + 1);
      sVar5._M_len = uVar2;
    }
  }
  return sVar5;
}

Assistant:

std::string_view removeQuotes(std::string_view str)
{
    std::string_view ret = trim(str);
    if (!ret.empty()) {
        if ((ret.front() == '\"') || (ret.front() == '\'') ||
            (ret.front() == '`')) {
            if (ret.back() == ret.front()) {
                return ret.substr(1, ret.size() - 2);
            }
        }
    }
    return ret;
}